

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_schnorr.cpp
# Opt level: O2

SchnorrKeyPairDataStruct *
cfd::js::api::json::SchnorrApi::TweakAddSchnorrPubkeyFromPrivkey
          (SchnorrKeyPairDataStruct *__return_storage_ptr__,TweakPrivkeyDataStruct *request)

{
  string *in_R8;
  allocator local_149;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  function<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&)>
  local_120;
  SchnorrKeyPairDataStruct local_100;
  
  SchnorrKeyPairDataStruct::SchnorrKeyPairDataStruct(__return_storage_ptr__);
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_130 = std::
              _Function_handler<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_schnorr.cpp:80:7)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_schnorr.cpp:80:7)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_120,"TweakAddSchnorrPubkeyFromPrivkey",&local_149);
  ExecuteStructApi<cfd::js::api::TweakPrivkeyDataStruct,cfd::js::api::SchnorrKeyPairDataStruct>
            (&local_100,(api *)request,(TweakPrivkeyDataStruct *)&local_148,&local_120,in_R8);
  SchnorrKeyPairDataStruct::operator=(__return_storage_ptr__,&local_100);
  SchnorrKeyPairDataStruct::~SchnorrKeyPairDataStruct(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::_Function_base::~_Function_base((_Function_base *)&local_148);
  return __return_storage_ptr__;
}

Assistant:

SchnorrKeyPairDataStruct SchnorrApi::TweakAddSchnorrPubkeyFromPrivkey(
    const TweakPrivkeyDataStruct& request) {
  auto call_func =
      [](const TweakPrivkeyDataStruct& request) -> SchnorrKeyPairDataStruct {
    SchnorrKeyPairDataStruct response;

    Privkey privkey(request.privkey);
    ByteData256 tweak(request.tweak);
    Privkey tweaked_privkey;
    bool parity = false;
    auto pubkey = SchnorrPubkey::CreateTweakAddFromPrivkey(
        privkey, tweak, &tweaked_privkey, &parity);
    response.pubkey = pubkey.GetHex();
    response.privkey = tweaked_privkey.GetHex();
    response.parity = parity;
    return response;
  };

  SchnorrKeyPairDataStruct result;
  result = ExecuteStructApi<TweakPrivkeyDataStruct, SchnorrKeyPairDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}